

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modified.cpp
# Opt level: O1

void __thiscall
alternative::alternative
          (alternative *this,int add,vector<int,_std::allocator<int>_> *_removed,
          vector<int,_std::allocator<int>_> *_vs,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *newAdj,branch_and_reduce_algorithm *_pAlg,int k)

{
  vector<int,std::allocator<int>> *this_00;
  int iVar1;
  int *piVar2;
  pointer pvVar3;
  int *piVar4;
  iterator __position;
  undefined8 in_RAX;
  int *piVar5;
  int *piVar6;
  int v;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  modified::modified(&this->super_modified,add,_removed,_vs,newAdj,_pAlg);
  (this->super_modified)._vptr_modified = (_func_int **)&PTR__modified_0012ebd8;
  *(int *)&(this->super_modified).field_0x64 = k;
  if (branch_and_reduce_algorithm::USE_DEPENDENCY_CHECKING == true) {
    (this->super_modified).foldingMapAdd = 0;
    piVar6 = (this->super_modified).removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->super_modified).removed.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar6 != piVar2) {
      do {
        iVar1 = *piVar6;
        uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
        pvVar3 = (((this->super_modified).pAlg)->packingMap).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pvVar3[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 8) !=
            pvVar3[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          piVar5 = &(this->super_modified).foldingMapAdd;
          *piVar5 = *piVar5 + 1;
          piVar4 = (this->super_modified).vs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (piVar5 = (this->super_modified).vs.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start; piVar5 != piVar4;
              piVar5 = piVar5 + 1) {
            this_00 = (vector<int,std::allocator<int>> *)
                      ((((this->super_modified).pAlg)->foldingMap).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *piVar5);
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int&>
                        (this_00,__position,(int *)((long)&uStack_38 + 4));
            }
            else {
              *__position._M_current = uStack_38._4_4_;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
          }
        }
        piVar6 = piVar6 + 1;
      } while (piVar6 != piVar2);
    }
  }
  return;
}

Assistant:

alternative::alternative(int const add, std::vector<int> &_removed, std::vector<int> &_vs, std::vector<std::vector<int>> &newAdj, branch_and_reduce_algorithm *_pAlg, int k)
    : modified(add, _removed, _vs, newAdj, _pAlg)
    {
        this->k = k;

        if (pAlg->USE_DEPENDENCY_CHECKING) {
            foldingMapAdd = 0;

            for (int v : removed) {
                if (pAlg->packingMap[v].size() != 0) {
                    foldingMapAdd += 1;
                    for (int vv : vs) {
                        pAlg->foldingMap[vv].emplace_back(v);
                    }
                }
            }        
        }
    }